

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMeshSolution.cpp
# Opt level: O2

void __thiscall TPZMeshSolution::Print(TPZMeshSolution *this,ostream *out)

{
  int iVar1;
  ostream *poVar2;
  
  poVar2 = std::operator<<(out,"virtual void TPZMeshSolution::Print(std::ostream &)");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(out,"NFunctions = ");
  iVar1 = (**(code **)((long)this->super_TPZFunction<double> + 0x70))(this);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(out,"Polynomial Order = ");
  iVar1 = (**(code **)((long)this->super_TPZFunction<double> + 0x68))(this);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void TPZMeshSolution::Print(std::ostream &out)
{
    out << __PRETTY_FUNCTION__ << std::endl;
    out << "NFunctions = " << NFunctions() << std::endl;
    out << "Polynomial Order = " << PolynomialOrder() << std::endl;
}